

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double orient2d(double *pa,double *pb,double *pc)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double adStack_1c8 [4];
  double dStack_1a8;
  undefined8 uStack_1a0;
  double dStack_198;
  undefined8 uStack_190;
  double dStack_188;
  undefined8 uStack_180;
  double dStack_178;
  undefined8 uStack_170;
  double dStack_168;
  undefined8 uStack_160;
  double dStack_158;
  double dStack_150;
  double dStack_148;
  double adStack_140 [17];
  double adStack_b8 [8];
  double adStack_78 [12];
  
  dVar10 = splitter;
  dVar5 = (pb[1] - pc[1]) * (*pa - *pc);
  dVar11 = (*pb - *pc) * (pa[1] - pc[1]);
  dVar8 = dVar5 - dVar11;
  if (dVar5 <= 0.0) {
    if (0.0 <= dVar5) {
      return dVar8;
    }
    if (0.0 <= dVar11) {
      return dVar8;
    }
    dVar5 = -dVar5 - dVar11;
  }
  else {
    if (dVar11 <= 0.0) {
      return dVar8;
    }
    dVar5 = dVar5 + dVar11;
  }
  if ((dVar8 < ccwerrboundA * dVar5) && (-dVar8 < ccwerrboundA * dVar5)) {
    dVar8 = *pa;
    dVar11 = pa[1];
    dVar23 = *pc;
    dVar24 = pc[1];
    dVar14 = dVar8 - dVar23;
    dVar6 = pb[1];
    dVar3 = dVar6 - dVar24;
    dVar19 = dVar14 * dVar3;
    dStack_168 = dVar14 * splitter - (dVar14 * splitter - dVar14);
    dVar15 = dVar14 - dStack_168;
    dVar9 = splitter * dVar3 - (splitter * dVar3 - dVar3);
    dVar12 = dVar3 - dVar9;
    dVar18 = dVar15 * dVar12 -
             (((dVar19 - dStack_168 * dVar9) - dVar15 * dVar9) - dStack_168 * dVar12);
    dVar4 = dVar11 - dVar24;
    dStack_188 = dVar4 * splitter - (dVar4 * splitter - dVar4);
    dVar7 = *pb;
    dVar13 = dVar7 - dVar23;
    dVar16 = dVar13 * splitter - (dVar13 * splitter - dVar13);
    dVar20 = dVar13 * dVar4;
    dStack_178 = dVar4 - dStack_188;
    dVar17 = dVar13 - dVar16;
    dVar21 = dStack_178 * dVar17 -
             (((dVar20 - dStack_188 * dVar16) - dStack_178 * dVar16) - dStack_188 * dVar17);
    dVar22 = dVar18 - dVar21;
    adStack_1c8[0] = (dVar18 - (dVar22 + (dVar18 - dVar22))) + ((dVar18 - dVar22) - dVar21);
    dVar21 = dVar19 + dVar22;
    dVar18 = (dVar19 - (dVar21 - (dVar21 - dVar19))) + (dVar22 - (dVar21 - dVar19));
    dVar19 = dVar18 - dVar20;
    adStack_1c8[1] = (dVar18 - (dVar19 + (dVar18 - dVar19))) + ((dVar18 - dVar19) - dVar20);
    adStack_1c8[3] = dVar21 + dVar19;
    adStack_1c8[2] =
         (dVar21 - (adStack_1c8[3] - (adStack_1c8[3] - dVar21))) +
         (dVar19 - (adStack_1c8[3] - dVar21));
    dStack_168 = -dStack_168;
    uStack_160 = 0x8000000000000000;
    dStack_1a8 = -dVar15;
    dStack_188 = -dStack_188;
    uStack_180 = 0x8000000000000000;
    uStack_170 = 0;
    dStack_198 = -dStack_178;
    lVar2 = 1;
    dVar18 = adStack_1c8[0];
    do {
      dVar18 = dVar18 + adStack_1c8[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    if ((dVar18 < ccwerrboundB * dVar5) && (-dVar18 < ccwerrboundB * dVar5)) {
      uStack_1a0 = 0x8000000000000000;
      uStack_190 = 0x8000000000000000;
      dVar8 = (dVar8 - (dVar14 + (dVar8 - dVar14))) + ((dVar8 - dVar14) - dVar23);
      dVar23 = (dVar7 - (dVar13 + (dVar7 - dVar13))) + ((dVar7 - dVar13) - dVar23);
      dVar11 = (dVar11 - (dVar4 + (dVar11 - dVar4))) + ((dVar11 - dVar4) - dVar24);
      dVar24 = (dVar6 - (dVar3 + (dVar6 - dVar3))) + ((dVar6 - dVar3) - dVar24);
      if ((((dVar8 != 0.0) ||
           ((((NAN(dVar8) || (dVar11 != 0.0)) || (NAN(dVar11))) ||
            ((dVar23 != 0.0 || (NAN(dVar23))))))) || (dVar24 != 0.0)) || (NAN(dVar24))) {
        dVar5 = dVar5 * ccwerrboundC + ABS(dVar18) * resulterrbound;
        dVar3 = dVar3 * dVar8;
        dVar14 = dVar14 * dVar24;
        dVar13 = dVar13 * dVar11;
        dVar4 = dVar4 * dVar23;
        dVar18 = ((dVar14 + dVar3) - (dVar4 + dVar13)) + dVar18;
        if ((dVar18 < dVar5) && (-dVar18 < dVar5)) {
          dVar6 = splitter * dVar8 - (splitter * dVar8 - dVar8);
          dVar19 = dVar8 - dVar6;
          dVar5 = dVar12 * dVar19 - (((dVar3 - dVar6 * dVar9) - dVar9 * dVar19) - dVar6 * dVar12);
          dVar7 = splitter * dVar11 - (splitter * dVar11 - dVar11);
          dVar9 = dVar11 - dVar7;
          dVar12 = dVar17 * dVar9 - (((dVar13 - dVar7 * dVar16) - dVar16 * dVar9) - dVar7 * dVar17);
          dVar18 = dVar5 - dVar12;
          dStack_158 = (dVar5 - (dVar18 + (dVar5 - dVar18))) + ((dVar5 - dVar18) - dVar12);
          dVar5 = dVar3 + dVar18;
          dVar3 = (dVar3 - (dVar5 - (dVar5 - dVar3))) + (dVar18 - (dVar5 - dVar3));
          dVar18 = dVar3 - dVar13;
          dStack_150 = (dVar3 - (dVar18 + (dVar3 - dVar18))) + ((dVar3 - dVar18) - dVar13);
          adStack_140[0] = dVar5 + dVar18;
          dStack_148 = (dVar5 - (adStack_140[0] - (adStack_140[0] - dVar5))) +
                       (dVar18 - (adStack_140[0] - dVar5));
          iVar1 = fast_expansion_sum_zeroelim(4,adStack_1c8,4,&dStack_158,adStack_b8);
          dVar3 = dVar10 * dVar24;
          dVar3 = dVar3 - (dVar3 - dVar24);
          dVar16 = dVar24 - dVar3;
          dVar5 = dVar15 * dVar16 -
                  (dStack_168 * dVar16 + dStack_1a8 * dVar3 + dStack_168 * dVar3 + dVar14);
          dVar10 = dVar10 * dVar23;
          dVar10 = dVar10 - (dVar10 - dVar23);
          dVar12 = dVar23 - dVar10;
          dVar13 = dStack_178 * dVar12 -
                   (dStack_188 * dVar12 + dStack_198 * dVar10 + dStack_188 * dVar10 + dVar4);
          dVar18 = dVar5 - dVar13;
          dStack_158 = (dVar5 - (dVar18 + (dVar5 - dVar18))) + ((dVar5 - dVar18) - dVar13);
          dVar5 = dVar14 + dVar18;
          dVar13 = (dVar14 - (dVar5 - (dVar5 - dVar14))) + (dVar18 - (dVar5 - dVar14));
          dVar18 = dVar13 - dVar4;
          dStack_150 = (dVar13 - (dVar18 + (dVar13 - dVar18))) + ((dVar13 - dVar18) - dVar4);
          adStack_140[0] = dVar5 + dVar18;
          dStack_148 = (dVar5 - (adStack_140[0] - (adStack_140[0] - dVar5))) +
                       (dVar18 - (adStack_140[0] - dVar5));
          iVar1 = fast_expansion_sum_zeroelim(iVar1,adStack_b8,4,&dStack_158,adStack_78);
          dVar8 = dVar8 * dVar24;
          dVar24 = dVar16 * dVar19 - (((dVar8 - dVar6 * dVar3) - dVar3 * dVar19) - dVar6 * dVar16);
          dVar23 = dVar23 * dVar11;
          dVar10 = dVar12 * dVar9 - (((dVar23 - dVar7 * dVar10) - dVar10 * dVar9) - dVar7 * dVar12);
          dVar5 = dVar24 - dVar10;
          dStack_158 = (dVar24 - (dVar5 + (dVar24 - dVar5))) + ((dVar24 - dVar5) - dVar10);
          dVar10 = dVar8 + dVar5;
          dVar8 = (dVar8 - (dVar10 - (dVar10 - dVar8))) + (dVar5 - (dVar10 - dVar8));
          dVar5 = dVar8 - dVar23;
          dStack_150 = (dVar8 - (dVar5 + (dVar8 - dVar5))) + ((dVar8 - dVar5) - dVar23);
          adStack_140[0] = dVar10 + dVar5;
          dStack_148 = (dVar10 - (adStack_140[0] - (adStack_140[0] - dVar10))) +
                       (dVar5 - (adStack_140[0] - dVar10));
          iVar1 = fast_expansion_sum_zeroelim(iVar1,adStack_78,4,&dStack_158,adStack_140 + 1);
          dVar18 = adStack_140[iVar1];
        }
      }
    }
    return dVar18;
  }
  return dVar8;
}

Assistant:

REAL orient2d(REAL *pa, REAL *pb, REAL *pc)
{
  REAL detleft, detright, det;
  REAL detsum, errbound;

  detleft = (pa[0] - pc[0]) * (pb[1] - pc[1]);
  detright = (pa[1] - pc[1]) * (pb[0] - pc[0]);
  det = detleft - detright;

  if (detleft > 0.0) {
    if (detright <= 0.0) {
      return det;
    } else {
      detsum = detleft + detright;
    }
  } else if (detleft < 0.0) {
    if (detright >= 0.0) {
      return det;
    } else {
      detsum = -detleft - detright;
    }
  } else {
    return det;
  }

  errbound = ccwerrboundA * detsum;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return orient2dadapt(pa, pb, pc, detsum);
}